

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_std::pair<const_void_*,_const_void_*>_&,_const_std::pair<const_void_*,_const_void_*>_&>
* __thiscall
Catch::ExprLhs<std::pair<void_const*,void_const*>const&>::operator!=
          (BinaryExpr<const_std::pair<const_void_*,_const_void_*>_&,_const_std::pair<const_void_*,_const_void_*>_&>
           *__return_storage_ptr__,ExprLhs<std::pair<void_const*,void_const*>const&> *this,
          pair<const_void_*,_const_void_*> *rhs)

{
  pair<const_void_*,_const_void_*> *ppVar1;
  undefined4 unaff_EBP;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  StringRef local_38;
  
  ppVar1 = *(pair<const_void_*,_const_void_*> **)this;
  auVar4._0_4_ = -(uint)(*(int *)&rhs->first == *(int *)&ppVar1->first);
  auVar4._4_4_ = -(uint)(*(int *)((long)&rhs->first + 4) == *(int *)((long)&ppVar1->first + 4));
  auVar4._8_4_ = -(uint)(*(int *)&rhs->second == *(int *)&ppVar1->second);
  auVar4._12_4_ = -(uint)(*(int *)((long)&rhs->second + 4) == *(int *)((long)&ppVar1->second + 4));
  auVar3._4_4_ = auVar4._0_4_;
  auVar3._0_4_ = auVar4._4_4_;
  auVar3._8_4_ = auVar4._12_4_;
  auVar3._12_4_ = auVar4._8_4_;
  iVar2 = movmskpd(unaff_EBP,auVar3 & auVar4);
  StringRef::StringRef(&local_38,"!=");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = iVar2 != 3;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_002c1758;
  __return_storage_ptr__->m_lhs = ppVar1;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator != ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareNotEqual( m_lhs, rhs ), m_lhs, "!=", rhs };
        }